

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testInputPart.cpp
# Opt level: O1

void anon_unknown.dwarf_22493e::testWriteRead
               (int partNumber,int runCount,int randomReadCount,string *tempDir)

{
  WritingTaskData *pWVar1;
  float fVar2;
  pointer pcVar3;
  void *pvVar4;
  FrameBuffer *pFVar5;
  size_type sVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  Header *pHVar9;
  Header *pHVar10;
  Array2D<Imf_3_2::FrameBuffer> *pAVar11;
  char cVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  uint uVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  undefined4 uVar20;
  int iVar21;
  int iVar22;
  ostream *poVar23;
  char *pcVar24;
  TileDescription *pTVar25;
  TiledOutputPart *this;
  ulong uVar26;
  ulong *puVar27;
  OutputPart *this_00;
  WritingTaskData *pWVar28;
  Task *pTVar29;
  undefined8 *puVar30;
  undefined8 *puVar31;
  float *pfVar32;
  float *pfVar33;
  int *piVar34;
  ChannelList *this_01;
  ChannelList *pCVar35;
  ThreadPool *this_02;
  ulong *puVar36;
  _Vector_base<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
  *p_Var37;
  WritingTaskData *pWVar38;
  ulong uVar39;
  ulong uVar40;
  pointer ppWVar41;
  size_type *psVar42;
  size_type sVar43;
  long lVar44;
  long *plVar45;
  size_type *psVar46;
  uint uVar47;
  Header *this_03;
  long lVar48;
  ulong uVar49;
  size_t sVar50;
  bool bVar51;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  vector<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
  list;
  Array2D<float> floatData;
  TaskGroup taskGroup;
  MultiPartOutputFile file;
  Array2D<unsigned_int> uintData;
  Array2D<Imath_3_2::half> halfData;
  Array<Imf_3_2::Array2D<Imf_3_2::FrameBuffer>_> tiledFrameBuffers;
  string fn;
  vector<Imf_3_2::FrameBuffer,_std::allocator<Imf_3_2::FrameBuffer>_> frameBuffers;
  vector<(anonymous_namespace)::WritingTaskData,_std::allocator<(anonymous_namespace)::WritingTaskData>_>
  taskList;
  int *numXTiles;
  vector<void_*,_std::allocator<void_*>_> parts;
  WritingTaskData *local_3a8;
  undefined1 local_398 [16];
  WritingTaskData *local_388;
  pointer local_378;
  ThreadPool *local_370;
  WritingTaskData *local_368;
  uint local_35c;
  Array2D<float> local_358;
  ulong local_338;
  _Vector_base<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
  *local_330;
  uint local_324;
  ulong local_320;
  WritingTaskData *local_318;
  int local_310 [3];
  uint local_304;
  long local_300;
  int *local_2f8 [2];
  Array2D<unsigned_int> local_2e8;
  Array2D<Imath_3_2::half> local_2c8;
  Array<Imf_3_2::Array2D<Imf_3_2::FrameBuffer>_> local_2b0;
  size_type *local_2a0;
  long *local_298 [2];
  long local_288 [2];
  int local_274;
  int local_270;
  int local_26c;
  Array2D<unsigned_int> local_268 [2];
  WritingTaskData *local_228;
  long lStack_220;
  long local_218;
  vector<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
  local_210;
  size_type *local_1f8;
  size_type *local_1f0;
  size_t local_1e8;
  size_type *local_1e0;
  size_type *local_1d8;
  size_type *local_1d0;
  size_t local_1c8;
  ulong local_1c0;
  _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
  local_1b8 [2];
  ios_base local_138 [264];
  
  local_270 = randomReadCount;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Testing file with ",0x12);
  local_35c = partNumber;
  poVar23 = (ostream *)std::ostream::operator<<(&std::cout,partNumber);
  std::__ostream_insert<char,std::char_traits<char>>(poVar23," part(s).",9);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar23 + -0x18) + (char)poVar23);
  std::ostream::put((char)poVar23);
  std::ostream::flush();
  std::ostream::flush();
  local_298[0] = local_288;
  pcVar3 = (tempDir->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_298,pcVar3,pcVar3 + tempDir->_M_string_length);
  std::__cxx11::string::append((char *)local_298);
  local_274 = runCount;
  if (0 < runCount) {
    local_338 = (ulong)local_35c;
    local_1c0 = local_338 * 0x18 + 8;
    local_1c8 = ((local_338 * 0x18 - 0x18) / 0x18) * 0x18 + 0x18;
    iVar13 = 0;
    do {
      local_26c = iVar13;
      local_2c8._data = (half *)0x0;
      local_2c8._sizeX = 0;
      local_2c8._sizeY = 0;
      local_358._data = (float *)0x0;
      local_358._sizeX = 0;
      local_358._sizeY = 0;
      local_2e8._data = (uint *)0x0;
      local_2e8._sizeX = 0;
      local_2e8._sizeY = 0;
      fillPixels<unsigned_int>(&local_2e8,0xc5,0x107);
      fillPixels<Imath_3_2::half>(&local_2c8,0xc5,0x107);
      fillPixels<float>(&local_358,0xc5,0x107);
      uVar26 = local_1c0;
      local_2a0 = (size_type *)operator_new__(local_1c0);
      sVar50 = local_1c8;
      uVar39 = local_338;
      *local_2a0 = local_338;
      local_1e0 = local_2a0 + 1;
      memset(local_1e0,0,local_1c8);
      local_1f0 = (size_type *)operator_new__(uVar26);
      *local_1f0 = uVar39;
      local_1d8 = local_1f0 + 1;
      memset(local_1d8,0,sVar50);
      local_1f8 = (size_type *)operator_new__(uVar26);
      *local_1f8 = uVar39;
      local_1d0 = local_1f8 + 1;
      memset(local_1d0,0,sVar50);
      local_228 = (WritingTaskData *)0x0;
      lStack_220 = 0;
      local_218 = 0;
      std::vector<int,_std::allocator<int>_>::resize
                ((vector<int,_std::allocator<int>_> *)&(anonymous_namespace)::pixelTypes,uVar39);
      std::vector<int,_std::allocator<int>_>::resize
                ((vector<int,_std::allocator<int>_> *)&(anonymous_namespace)::partTypes,local_338);
      std::vector<int,_std::allocator<int>_>::resize
                ((vector<int,_std::allocator<int>_> *)&(anonymous_namespace)::levelModes,local_338);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Generating headers and data ",0x1c);
      std::ostream::flush();
      pHVar10 = DAT_001efc30;
      pHVar9 = (anonymous_namespace)::headers;
      this_03 = (anonymous_namespace)::headers;
      if (DAT_001efc30 != (anonymous_namespace)::headers) {
        do {
          Imf_3_2::Header::~Header(this_03);
          this_03 = this_03 + 0x38;
        } while (this_03 != pHVar10);
        DAT_001efc30 = pHVar9;
      }
      if (0 < (int)local_35c) {
        sVar43 = 0;
        do {
          local_1b8[0]._M_impl._0_8_ = 0;
          Imf_3_2::Header::Header
                    ((Header *)local_268,0xc5,0x107,1.0,(Vec2 *)local_1b8,1.0,INCREASING_Y,
                     ZIP_COMPRESSION);
          iVar13 = random_int(3);
          iVar14 = random_int(2);
          *(int *)((anonymous_namespace)::pixelTypes + sVar43 * 4) = iVar13;
          *(int *)((anonymous_namespace)::partTypes + sVar43 * 4) = iVar14;
          std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
          iVar19 = (int)sVar43;
          std::ostream::operator<<
                    (&local_1b8[0]._M_impl.super__Rb_tree_header._M_header._M_parent,iVar19);
          std::__cxx11::stringbuf::str();
          Imf_3_2::Header::setName((string *)local_268);
          if ((TiledOutputPart *)local_398._0_8_ != (TiledOutputPart *)&local_388) {
            operator_delete((void *)local_398._0_8_,(long)local_388 + 1);
          }
          if (iVar13 == 0) {
            pcVar24 = (char *)Imf_3_2::Header::channels();
            Imf_3_2::Channel::Channel((Channel *)local_398,UINT,1,1,false);
            Imf_3_2::ChannelList::insert(pcVar24,(Channel *)"UINT");
          }
          else if (iVar13 == 1) {
            pcVar24 = (char *)Imf_3_2::Header::channels();
            Imf_3_2::Channel::Channel((Channel *)local_398,FLOAT,1,1,false);
            Imf_3_2::ChannelList::insert(pcVar24,(Channel *)"FLOAT");
          }
          else if (iVar13 == 2) {
            pcVar24 = (char *)Imf_3_2::Header::channels();
            Imf_3_2::Channel::Channel((Channel *)local_398,HALF,1,1,false);
            Imf_3_2::ChannelList::insert(pcVar24,(Channel *)"HALF");
          }
          bVar51 = true;
          if (((iVar14 == 0) || (iVar14 == 1)) &&
             (Imf_3_2::Header::setType((string *)local_268), iVar14 == 1)) {
            iVar13 = random_int(0xc5);
            iVar15 = random_int(0x107);
            uVar16 = random_int(3);
            *(uint *)((anonymous_namespace)::levelModes + sVar43 * 4) = uVar16;
            local_398._8_4_ = 3;
            if (uVar16 < 3) {
              local_398._8_4_ = uVar16;
            }
            local_398._4_4_ = iVar15 + 1;
            local_398._0_4_ = iVar13 + 1;
            local_398._12_4_ = 0;
            Imf_3_2::Header::setTileDescription((TileDescription *)local_268);
            bVar51 = uVar16 != 1;
          }
          if (iVar14 == 0) {
            iVar13 = 0x107;
            do {
              local_398._0_4_ = iVar19;
              std::
              vector<(anonymous_namespace)::WritingTaskData,_std::allocator<(anonymous_namespace)::WritingTaskData>_>
              ::push_back((vector<(anonymous_namespace)::WritingTaskData,_std::allocator<(anonymous_namespace)::WritingTaskData>_>
                           *)&local_228,(value_type *)local_398);
              iVar13 = iVar13 + -1;
            } while (iVar13 != 0);
          }
          else {
            pTVar25 = (TileDescription *)Imf_3_2::Header::tileDescription();
            Imf_3_2::precalculateTileInfo
                      (pTVar25,0,0xc4,0,0x106,(int **)&local_210,local_2f8,(int *)&local_2b0,
                       local_310);
            if (0 < (int)local_2b0._size) {
              lVar48 = 0;
              do {
                if (0 < local_310[0]) {
                  lVar44 = 0;
                  do {
                    if ((!(bool)(~bVar51 & lVar48 != lVar44)) &&
                       (0 < *(int *)((long)local_210.
                                           super__Vector_base<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
                                           ._M_impl.super__Vector_impl_data._M_start + lVar48 * 4)))
                    {
                      iVar13 = 0;
                      do {
                        if (0 < local_2f8[0][lVar44]) {
                          iVar14 = 0;
                          do {
                            local_398._0_8_ = CONCAT44(iVar13,iVar19);
                            local_398._12_4_ = (int)lVar48;
                            local_398._8_4_ = iVar14;
                            local_388 = (WritingTaskData *)CONCAT44(local_388._4_4_,(int)lVar44);
                            std::
                            vector<(anonymous_namespace)::WritingTaskData,_std::allocator<(anonymous_namespace)::WritingTaskData>_>
                            ::push_back((vector<(anonymous_namespace)::WritingTaskData,_std::allocator<(anonymous_namespace)::WritingTaskData>_>
                                         *)&local_228,(value_type *)local_398);
                            iVar14 = iVar14 + 1;
                          } while (iVar14 < local_2f8[0][lVar44]);
                        }
                        iVar13 = iVar13 + 1;
                      } while (iVar13 < *(int *)((long)local_210.
                                                                                                              
                                                  super__Vector_base<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_start +
                                                lVar48 * 4));
                    }
                    lVar44 = lVar44 + 1;
                  } while (lVar44 < local_310[0]);
                }
                lVar48 = lVar48 + 1;
              } while (lVar48 < (int)local_2b0._size);
            }
            if (local_210.
                super__Vector_base<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
                ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete__(local_210.
                                super__Vector_base<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
                                ._M_impl.super__Vector_impl_data._M_start);
            }
            if (local_2f8[0] != (int *)0x0) {
              operator_delete__(local_2f8[0]);
            }
          }
          std::vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>::push_back
                    ((vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_> *)
                     &(anonymous_namespace)::headers,(value_type *)local_268);
          std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
          std::ios_base::~ios_base(local_138);
          Imf_3_2::Header::~Header((Header *)local_268);
          sVar43 = sVar43 + 1;
        } while (sVar43 != local_338);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Shuffling ",10);
      pWVar38 = local_228;
      local_320 = (lStack_220 - (long)local_228 >> 2) * -0x3333333333333333;
      poVar23 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>(poVar23," tasks ",7);
      std::ostream::flush();
      uVar39 = local_320 & 0xffffffff;
      if (0 < (int)local_320) {
        do {
          iVar13 = (int)local_320;
          iVar17 = random_int(iVar13);
          iVar18 = random_int(iVar13);
          iVar13 = pWVar38[iVar17].ly;
          local_1b8[0]._M_impl.super__Rb_tree_header._M_header._M_parent =
               (_Base_ptr)
               CONCAT44(local_1b8[0]._M_impl.super__Rb_tree_header._M_header._M_parent._4_4_,iVar13)
          ;
          pWVar28 = pWVar38 + iVar17;
          local_1b8[0]._M_impl._0_4_ = pWVar28->partNumber;
          local_1b8[0]._M_impl._4_4_ = pWVar28->tx;
          local_1b8[0]._M_impl.super__Rb_tree_header._M_header._M_color = pWVar28->ty;
          local_1b8[0]._M_impl.super__Rb_tree_header._M_header._4_4_ = pWVar28->lx;
          pWVar38[iVar17].ly = pWVar38[iVar18].ly;
          pWVar28 = pWVar38 + iVar18;
          iVar14 = pWVar28->tx;
          iVar19 = pWVar28->ty;
          iVar15 = pWVar28->lx;
          pWVar1 = pWVar38 + iVar17;
          pWVar1->partNumber = pWVar28->partNumber;
          pWVar1->tx = iVar14;
          pWVar1->ty = iVar19;
          pWVar1->lx = iVar15;
          pWVar38[iVar18].ly = iVar13;
          pWVar28 = pWVar38 + iVar18;
          pWVar28->partNumber = local_1b8[0]._M_impl._0_4_;
          pWVar28->tx = local_1b8[0]._M_impl._4_4_;
          pWVar28->ty = local_1b8[0]._M_impl.super__Rb_tree_header._M_header._M_color;
          pWVar28->lx = local_1b8[0]._M_impl.super__Rb_tree_header._M_header._4_4_;
          uVar16 = (int)uVar39 - 1;
          uVar39 = (ulong)uVar16;
        } while (uVar16 != 0);
      }
      remove((char *)local_298[0]);
      plVar45 = local_298[0];
      pHVar10 = DAT_001efc30;
      pHVar9 = (anonymous_namespace)::headers;
      iVar13 = Imf_3_2::globalThreadCount();
      Imf_3_2::MultiPartOutputFile::MultiPartOutputFile
                ((MultiPartOutputFile *)local_2f8,(char *)plVar45,pHVar9,
                 (int)((ulong)((long)pHVar10 - (long)pHVar9) >> 3) * -0x49249249,false,iVar13);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Writing tasks ",0xe)
      ;
      std::ostream::flush();
      uVar39 = local_338;
      local_1b8[0]._M_impl._0_8_ = (void *)0x0;
      local_1b8[0]._M_impl.super__Rb_tree_header._M_header._0_8_ = 0;
      local_1b8[0]._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      std::vector<Imf_3_2::FrameBuffer,_std::allocator<Imf_3_2::FrameBuffer>_>::vector
                ((vector<Imf_3_2::FrameBuffer,_std::allocator<Imf_3_2::FrameBuffer>_> *)local_268,
                 local_338,(allocator_type *)local_398);
      Imf_3_2::Array<Imf_3_2::Array2D<Imf_3_2::FrameBuffer>_>::Array(&local_2b0,uVar39);
      if (0 < (int)local_35c) {
        uVar39 = 0;
        do {
          if (*(int *)((anonymous_namespace)::partTypes + uVar39 * 4) == 0) {
            this_00 = (OutputPart *)operator_new(8);
            Imf_3_2::OutputPart::OutputPart(this_00,(MultiPartOutputFile *)local_2f8,(int)uVar39);
            local_398._0_8_ = this_00;
            std::vector<void*,std::allocator<void*>>::emplace_back<void*>
                      ((vector<void*,std::allocator<void*>> *)local_1b8,(void **)local_398);
            setOutputFrameBuffer
                      ((FrameBuffer *)(local_268[0]._sizeX + uVar39 * 0x30),
                       *(int *)((anonymous_namespace)::pixelTypes + uVar39 * 4),&local_2e8,
                       &local_358,&local_2c8,0xc5);
            Imf_3_2::OutputPart::setFrameBuffer((FrameBuffer *)this_00);
          }
          else {
            this = (TiledOutputPart *)operator_new(8);
            Imf_3_2::TiledOutputPart::TiledOutputPart
                      (this,(MultiPartOutputFile *)local_2f8,(int)uVar39);
            local_398._0_8_ = this;
            std::vector<void*,std::allocator<void*>>::emplace_back<void*>
                      ((vector<void*,std::allocator<void*>> *)local_1b8,(void **)local_398);
            local_304 = Imf_3_2::TiledOutputPart::numXLevels();
            local_324 = Imf_3_2::TiledOutputPart::numYLevels();
            local_318 = (WritingTaskData *)(long)(int)local_324;
            local_378 = (pointer)(long)(int)local_304;
            uVar40 = (long)local_318 * (long)local_378;
            auVar7._8_8_ = 0;
            auVar7._0_8_ = uVar40;
            uVar26 = SUB168(auVar7 * ZEXT816(0x18),0);
            uVar49 = uVar26 + 8;
            if (0xfffffffffffffff7 < uVar26) {
              uVar49 = 0xffffffffffffffff;
            }
            if (SUB168(auVar7 * ZEXT816(0x18),8) != 0) {
              uVar49 = 0xffffffffffffffff;
            }
            puVar27 = (ulong *)operator_new__(uVar49);
            *puVar27 = uVar40;
            if (uVar40 != 0) {
              memset(puVar27 + 1,0,((uVar40 * 0x18 - 0x18) / 0x18) * 0x18 + 0x18);
            }
            local_300 = uVar39 * 3;
            local_330 = (_Vector_base<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
                         *)(local_1d0 + uVar39 * 3);
            ppWVar41 = *(pointer *)((long)&(local_330->_M_impl).super__Vector_impl_data + 0x10);
            if (ppWVar41 != (pointer)0x0) {
              local_368 = ppWVar41[-1];
              if (local_368 != (WritingTaskData *)0x0) {
                lVar48 = (long)local_368 * 0x18;
                do {
                  pvVar4 = *(void **)((long)(ppWVar41 + -1) + lVar48);
                  if (pvVar4 != (void *)0x0) {
                    operator_delete__(pvVar4);
                  }
                  lVar48 = lVar48 + -0x18;
                } while (lVar48 != 0);
              }
              operator_delete__(ppWVar41 + -1,(long)local_368 * 0x18 + 8);
            }
            (local_330->_M_impl).super__Vector_impl_data._M_start = (pointer)local_318;
            *(pointer *)((long)&(local_330->_M_impl).super__Vector_impl_data + 8) = local_378;
            *(ulong **)((long)&(local_330->_M_impl).super__Vector_impl_data + 0x10) = puVar27 + 1;
            puVar27 = (ulong *)operator_new__(uVar49);
            *puVar27 = uVar40;
            if (uVar40 != 0) {
              memset(puVar27 + 1,0,((uVar40 * 0x18 - 0x18) / 0x18) * 0x18 + 0x18);
            }
            local_368 = (WritingTaskData *)(local_1d8 + local_300);
            lVar48 = *(long *)&local_368->ly;
            if (lVar48 != 0) {
              local_370 = *(ThreadPool **)(lVar48 + -8);
              if (local_370 != (ThreadPool *)0x0) {
                lVar44 = (long)local_370 * 0x18;
                do {
                  pvVar4 = *(void **)(lVar48 + -8 + lVar44);
                  if (pvVar4 != (void *)0x0) {
                    operator_delete__(pvVar4);
                  }
                  lVar44 = lVar44 + -0x18;
                } while (lVar44 != 0);
              }
              operator_delete__((void *)(lVar48 + -8),(long)local_370 * 0x18 + 8);
            }
            *(WritingTaskData **)local_368 = local_318;
            *(pointer *)&local_368->ty = local_378;
            *(ulong **)&local_368->ly = puVar27 + 1;
            puVar27 = (ulong *)operator_new__(uVar49);
            *puVar27 = uVar40;
            if (uVar40 != 0) {
              memset(puVar27 + 1,0,((uVar40 * 0x18 - 0x18) / 0x18) * 0x18 + 0x18);
            }
            local_370 = (ThreadPool *)(local_1e0 + local_300);
            uVar26 = *(ulong *)(local_370 + 0x10);
            if (uVar26 != 0) {
              lVar48 = *(long *)(uVar26 - 8);
              if (lVar48 != 0) {
                lVar44 = lVar48 * 0x18;
                do {
                  pvVar4 = *(void **)((long)(uVar26 - 8) + lVar44);
                  if (pvVar4 != (void *)0x0) {
                    operator_delete__(pvVar4);
                  }
                  lVar44 = lVar44 + -0x18;
                } while (lVar44 != 0);
              }
              operator_delete__((void *)(uVar26 - 8),lVar48 * 0x18 + 8);
            }
            auVar8._8_8_ = 0;
            auVar8._0_8_ = uVar40;
            uVar26 = SUB168(auVar8 * ZEXT816(0x30),0) | 8;
            *(WritingTaskData **)local_370 = local_318;
            *(pointer *)(local_370 + 8) = local_378;
            if (SUB168(auVar8 * ZEXT816(0x30),8) != 0) {
              uVar26 = 0xffffffffffffffff;
            }
            *(ulong **)(local_370 + 0x10) = puVar27 + 1;
            plVar45 = &(local_2b0._data)->_sizeX + local_300;
            puVar27 = (ulong *)operator_new__(uVar26);
            *puVar27 = uVar40;
            if (uVar40 != 0) {
              lVar48 = uVar40 * 0x30;
              puVar36 = puVar27 + 2;
              do {
                *(undefined4 *)puVar36 = 0;
                puVar36[1] = 0;
                puVar36[2] = (ulong)puVar36;
                puVar36[3] = (ulong)puVar36;
                puVar36[4] = 0;
                puVar36 = puVar36 + 6;
                lVar48 = lVar48 + -0x30;
              } while (lVar48 != 0);
            }
            pFVar5 = (FrameBuffer *)plVar45[2];
            if (pFVar5 != (FrameBuffer *)0x0) {
              local_1e8 = pFVar5[-1]._map._M_t._M_impl.super__Rb_tree_header._M_node_count;
              if (local_1e8 != 0) {
                lVar48 = local_1e8 * 0x30;
                do {
                  std::
                  _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
                  ::~_Rb_tree((_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
                               *)(&pFVar5[-1]._map._M_t._M_impl.field_0x0 + lVar48));
                  lVar48 = lVar48 + -0x30;
                } while (lVar48 != 0);
              }
              operator_delete__(&pFVar5[-1]._map._M_t._M_impl.super__Rb_tree_header._M_node_count,
                                local_1e8 * 0x30 + 8);
            }
            *plVar45 = (long)local_318;
            plVar45[1] = (long)local_378;
            plVar45[2] = (long)(puVar27 + 1);
            if (0 < (int)local_378) {
              local_318 = (WritingTaskData *)(ulong)local_304;
              local_378 = (pointer)(ulong)local_324;
              pWVar38 = (WritingTaskData *)0x0;
              do {
                if (0 < (int)local_324) {
                  lVar48 = 0;
                  do {
                    iVar13 = (int)this;
                    cVar12 = Imf_3_2::TiledOutputPart::isValidLevel(iVar13,(int)pWVar38);
                    if (cVar12 != '\0') {
                      iVar14 = Imf_3_2::TiledOutputPart::levelWidth(iVar13);
                      iVar19 = Imf_3_2::TiledOutputPart::levelHeight(iVar13);
                      lVar44 = (&(local_2b0._data)->_sizeY)[local_300];
                      pFVar5 = (&(local_2b0._data)->_data)[local_300];
                      iVar13 = *(int *)((anonymous_namespace)::pixelTypes + uVar39 * 4);
                      if (iVar13 == 0) {
                        fillPixels<unsigned_int>
                                  ((Array2D<unsigned_int> *)
                                   (*(pointer *)
                                     ((long)&(local_330->_M_impl).super__Vector_impl_data + 0x10) +
                                   (long)*(pointer *)
                                          ((long)&(local_330->_M_impl).super__Vector_impl_data + 8)
                                   * lVar48 * 3 + (long)pWVar38 * 3),iVar14,iVar19);
                      }
                      else if (iVar13 == 1) {
                        fillPixels<float>((Array2D<float> *)
                                          (*(long *)&local_368->ly +
                                          (long)pWVar38 * 0x18 +
                                          *(long *)&local_368->ty * lVar48 * 0x18),iVar14,iVar19);
                      }
                      else if (iVar13 == 2) {
                        fillPixels<Imath_3_2::half>
                                  ((Array2D<Imath_3_2::half> *)
                                   (*(ulong *)(local_370 + 8) * lVar48 * 0x18 +
                                    *(ulong *)(local_370 + 0x10) + (long)pWVar38 * 0x18),iVar14,
                                   iVar19);
                      }
                      setOutputFrameBuffer
                                (pFVar5 + (long)((long)&pWVar38->partNumber + lVar44 * lVar48),
                                 *(int *)((anonymous_namespace)::pixelTypes + uVar39 * 4),
                                 (Array2D<unsigned_int> *)
                                 (*(pointer *)
                                   ((long)&(local_330->_M_impl).super__Vector_impl_data + 0x10) +
                                 (long)*(pointer *)
                                        ((long)&(local_330->_M_impl).super__Vector_impl_data + 8) *
                                 lVar48 * 3 + (long)pWVar38 * 3),
                                 (Array2D<float> *)
                                 (*(long *)&local_368->ly +
                                 (long)pWVar38 * 0x18 + *(long *)&local_368->ty * lVar48 * 0x18),
                                 (Array2D<Imath_3_2::half> *)
                                 (*(ulong *)(local_370 + 8) * lVar48 * 0x18 +
                                  *(ulong *)(local_370 + 0x10) + (long)pWVar38 * 0x18),iVar14);
                    }
                    lVar48 = lVar48 + 1;
                  } while (local_378 != (pointer)lVar48);
                }
                pWVar38 = (WritingTaskData *)((long)&pWVar38->partNumber + 1);
              } while (pWVar38 != local_318);
            }
          }
          uVar39 = uVar39 + 1;
        } while (uVar39 != local_338);
      }
      IlmThread_3_2::TaskGroup::TaskGroup((TaskGroup *)local_310);
      local_370 = (ThreadPool *)operator_new(0x10);
      IlmThread_3_2::ThreadPool::ThreadPool(local_370,0x20);
      local_398._0_8_ = (WritingTaskData *)0x0;
      local_398._8_8_ = (WritingTaskData *)0x0;
      local_388 = (WritingTaskData *)0x0;
      if (0 < (int)(uint)local_320) {
        local_3a8 = (WritingTaskData *)0x0;
        uVar16 = (uint)local_320 - 1;
        local_320 = -(ulong)((uint)local_320 & 0x7fffffff);
        local_378 = (pointer)-(ulong)uVar16;
        uVar39 = 0;
        ppWVar41 = (pointer)0x0;
        pWVar38 = local_228;
        do {
          if ((WritingTaskData *)local_398._8_8_ == local_388) {
            sVar50 = local_398._8_8_ - (long)local_3a8;
            if (sVar50 == 0x7ffffffffffffff8) {
              std::__throw_length_error("vector::_M_realloc_insert");
            }
            uVar40 = (long)sVar50 >> 3;
            uVar26 = 1;
            if ((WritingTaskData *)local_398._8_8_ != local_3a8) {
              uVar26 = uVar40;
            }
            p_Var37 = (_Vector_base<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
                       *)(uVar26 + uVar40);
            if ((_Vector_base<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
                 *)0xffffffffffffffe < p_Var37) {
              p_Var37 = (_Vector_base<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
                         *)0xfffffffffffffff;
            }
            local_330 = (_Vector_base<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
                         *)0xfffffffffffffff;
            if (!CARRY8(uVar26,uVar40)) {
              local_330 = p_Var37;
            }
            local_368 = local_388;
            pWVar28 = (WritingTaskData *)
                      std::
                      _Vector_base<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
                      ::_M_allocate(local_330,(size_t)local_330);
            *(WritingTaskData **)((long)pWVar28 + sVar50) = pWVar38;
            if (0 < (long)sVar50) {
              memmove(pWVar28,local_3a8,sVar50);
            }
            if (local_3a8 != (WritingTaskData *)0x0) {
              operator_delete(local_3a8,(long)local_368 - (long)local_3a8);
            }
            local_398._8_8_ = sVar50 + (long)pWVar28;
            local_388 = (WritingTaskData *)(&pWVar28->partNumber + (long)local_330 * 2);
            local_3a8 = pWVar28;
            local_398._0_8_ = pWVar28;
          }
          else {
            *(WritingTaskData **)local_398._8_8_ = pWVar38;
          }
          local_398._8_8_ = &((WritingTaskData *)local_398._8_8_)->ty;
          if (((int)(uVar39 / 10) * -10 == (int)ppWVar41) || (local_378 == ppWVar41)) {
            pTVar29 = (Task *)operator_new(0x38);
            std::
            vector<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
            ::vector(&local_210,
                     (vector<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
                      *)local_398);
            pAVar11 = local_2b0._data;
            IlmThread_3_2::Task::Task(pTVar29,(TaskGroup *)local_310);
            *(undefined ***)pTVar29 = &PTR__WritingTask_001ec270;
            *(int ***)(pTVar29 + 0x10) = local_2f8;
            std::
            vector<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
            ::vector((vector<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
                      *)(pTVar29 + 0x18),&local_210);
            *(Array2D<Imf_3_2::FrameBuffer> **)(pTVar29 + 0x30) = pAVar11;
            IlmThread_3_2::ThreadPool::addTask((Task *)local_370);
            if (local_210.
                super__Vector_base<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
                ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_210.
                              super__Vector_base<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                              (long)local_210.
                                    super__Vector_base<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_210.
                                    super__Vector_base<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
            }
            local_398._8_8_ = local_3a8;
          }
          ppWVar41 = (pointer)((long)ppWVar41 - 1);
          uVar39 = (ulong)((int)uVar39 + 1);
          pWVar38 = pWVar38 + 1;
        } while ((pointer)local_320 != ppWVar41);
      }
      psVar42 = local_2a0;
      if (0 < (int)local_35c) {
        uVar39 = 0;
        do {
          pvVar4 = *(void **)(local_1b8[0]._M_impl._0_8_ + uVar39 * 8);
          if (pvVar4 != (void *)0x0) {
            operator_delete(pvVar4,8);
          }
          uVar39 = uVar39 + 1;
        } while (local_338 != uVar39);
      }
      (**(code **)(*(ulong *)local_370 + 8))();
      sVar43 = *psVar42;
      if (sVar43 != 0) {
        psVar42 = local_2a0 + sVar43 * 3 + 1;
        do {
          sVar6 = psVar42[-1];
          if (sVar6 != 0) {
            lVar48 = *(long *)(sVar6 - 8);
            if (lVar48 != 0) {
              lVar44 = lVar48 * 0x18;
              do {
                pvVar4 = *(void **)((long)(sVar6 - 8) + lVar44);
                if (pvVar4 != (void *)0x0) {
                  operator_delete__(pvVar4);
                }
                lVar44 = lVar44 + -0x18;
              } while (lVar44 != 0);
            }
            operator_delete__((void *)(sVar6 - 8),lVar48 * 0x18 + 8);
          }
          psVar42 = psVar42 + -3;
        } while (psVar42 != local_1e0);
      }
      operator_delete__(local_2a0,sVar43 * 0x18 + 8);
      sVar43 = *local_1f8;
      psVar42 = local_1f8;
      if (sVar43 != 0) {
        psVar46 = local_1f8 + sVar43 * 3 + 1;
        do {
          sVar6 = psVar46[-1];
          if (sVar6 != 0) {
            lVar48 = *(long *)(sVar6 - 8);
            if (lVar48 != 0) {
              lVar44 = lVar48 * 0x18;
              do {
                pvVar4 = *(void **)((long)(sVar6 - 8) + lVar44);
                if (pvVar4 != (void *)0x0) {
                  operator_delete__(pvVar4);
                }
                lVar44 = lVar44 + -0x18;
              } while (lVar44 != 0);
            }
            operator_delete__((void *)(sVar6 - 8),lVar48 * 0x18 + 8);
            psVar42 = local_1f8;
          }
          psVar46 = psVar46 + -3;
        } while (psVar46 != local_1d0);
      }
      operator_delete__(psVar42,sVar43 * 0x18 + 8);
      sVar43 = *local_1f0;
      psVar42 = local_1f0;
      if (sVar43 != 0) {
        psVar46 = local_1f0 + sVar43 * 3 + 1;
        do {
          sVar6 = psVar46[-1];
          if (sVar6 != 0) {
            lVar48 = *(long *)(sVar6 - 8);
            if (lVar48 != 0) {
              lVar44 = lVar48 * 0x18;
              do {
                pvVar4 = *(void **)((long)(sVar6 - 8) + lVar44);
                if (pvVar4 != (void *)0x0) {
                  operator_delete__(pvVar4);
                }
                lVar44 = lVar44 + -0x18;
              } while (lVar44 != 0);
            }
            operator_delete__((void *)(sVar6 - 8),lVar48 * 0x18 + 8);
            psVar42 = local_1f0;
          }
          psVar46 = psVar46 + -3;
        } while (psVar46 != local_1d8);
      }
      operator_delete__(psVar42,sVar43 * 0x18 + 8);
      if ((WritingTaskData *)local_398._0_8_ != (WritingTaskData *)0x0) {
        operator_delete((void *)local_398._0_8_,(long)local_388 - local_398._0_8_);
      }
      IlmThread_3_2::TaskGroup::~TaskGroup((TaskGroup *)local_310);
      Imf_3_2::Array<Imf_3_2::Array2D<Imf_3_2::FrameBuffer>_>::~Array(&local_2b0);
      std::vector<Imf_3_2::FrameBuffer,_std::allocator<Imf_3_2::FrameBuffer>_>::~vector
                ((vector<Imf_3_2::FrameBuffer,_std::allocator<Imf_3_2::FrameBuffer>_> *)local_268);
      if ((void *)local_1b8[0]._M_impl._0_8_ != (void *)0x0) {
        operator_delete((void *)local_1b8[0]._M_impl._0_8_,
                        (long)local_1b8[0]._M_impl.super__Rb_tree_header._M_header._M_parent -
                        local_1b8[0]._M_impl._0_8_);
      }
      Imf_3_2::MultiPartOutputFile::~MultiPartOutputFile((MultiPartOutputFile *)local_2f8);
      if (local_228 != (WritingTaskData *)0x0) {
        operator_delete(local_228,local_218 - (long)local_228);
      }
      if (local_2e8._data != (uint *)0x0) {
        operator_delete__(local_2e8._data);
      }
      if (local_358._data != (float *)0x0) {
        operator_delete__(local_358._data);
      }
      if (local_2c8._data != (half *)0x0) {
        operator_delete__(local_2c8._data);
      }
      plVar45 = local_298[0];
      local_268[0]._data = (uint *)0x0;
      local_268[0]._sizeX = 0;
      local_268[0]._sizeY = 0;
      local_388 = (WritingTaskData *)0x0;
      local_398._0_8_ = (TiledOutputPart *)0x0;
      local_398._8_8_ = (pointer)0x0;
      local_2c8._data = (half *)0x0;
      local_2c8._sizeX = 0;
      local_2c8._sizeY = 0;
      iVar13 = Imf_3_2::globalThreadCount();
      uVar39 = 1;
      Imf_3_2::MultiPartInputFile::MultiPartInputFile
                ((MultiPartInputFile *)&local_2e8,(char *)plVar45,iVar13,true);
      uVar26 = 0;
      while( true ) {
        uVar20 = (undefined4)uVar39;
        iVar13 = Imf_3_2::MultiPartInputFile::parts();
        if ((ulong)(long)iVar13 <= uVar26) break;
        Imf_3_2::MultiPartInputFile::header((int)&local_2e8);
        puVar30 = (undefined8 *)Imf_3_2::Header::displayWindow();
        puVar31 = (undefined8 *)Imf_3_2::Header::displayWindow();
        iVar13 = -(uint)((int)*puVar31 == (int)*puVar30);
        iVar14 = -(uint)((int)((ulong)*puVar31 >> 0x20) == (int)((ulong)*puVar30 >> 0x20));
        auVar52._4_4_ = iVar13;
        auVar52._0_4_ = iVar13;
        auVar52._8_4_ = iVar14;
        auVar52._12_4_ = iVar14;
        iVar13 = movmskpd(uVar20,auVar52);
        if ((iVar13 != 3) ||
           (iVar14 = -(uint)((int)puVar31[1] == (int)puVar30[1]),
           iVar19 = -(uint)((int)((ulong)puVar31[1] >> 0x20) == (int)((ulong)puVar30[1] >> 0x20)),
           auVar53._4_4_ = iVar14, auVar53._0_4_ = iVar14, auVar53._8_4_ = iVar19,
           auVar53._12_4_ = iVar19, iVar14 = movmskpd((int)puVar31,auVar53), iVar14 != 3)) {
          __assert_fail("header.displayWindow () == headers[i].displayWindow ()",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testMultiPartThreading.cpp"
                        ,0x298,"void (anonymous namespace)::readWholeFiles(const std::string &)");
        }
        puVar30 = (undefined8 *)Imf_3_2::Header::dataWindow();
        puVar31 = (undefined8 *)Imf_3_2::Header::dataWindow();
        iVar14 = -(uint)((int)*puVar31 == (int)*puVar30);
        iVar19 = -(uint)((int)((ulong)*puVar31 >> 0x20) == (int)((ulong)*puVar30 >> 0x20));
        auVar54._4_4_ = iVar14;
        auVar54._0_4_ = iVar14;
        auVar54._8_4_ = iVar19;
        auVar54._12_4_ = iVar19;
        uVar16 = movmskpd(iVar13,auVar54);
        uVar39 = (ulong)uVar16;
        if ((uVar16 != 3) ||
           (iVar13 = -(uint)((int)puVar31[1] == (int)puVar30[1]),
           iVar14 = -(uint)((int)((ulong)puVar31[1] >> 0x20) == (int)((ulong)puVar30[1] >> 0x20)),
           auVar55._4_4_ = iVar13, auVar55._0_4_ = iVar13, auVar55._8_4_ = iVar14,
           auVar55._12_4_ = iVar14, iVar13 = movmskpd((int)puVar31,auVar55), iVar13 != 3)) {
          __assert_fail("header.dataWindow () == headers[i].dataWindow ()",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testMultiPartThreading.cpp"
                        ,0x299,"void (anonymous namespace)::readWholeFiles(const std::string &)");
        }
        pfVar32 = (float *)Imf_3_2::Header::pixelAspectRatio();
        fVar2 = *pfVar32;
        pfVar32 = (float *)Imf_3_2::Header::pixelAspectRatio();
        if ((fVar2 != *pfVar32) || (NAN(fVar2) || NAN(*pfVar32))) {
          __assert_fail("header.pixelAspectRatio () == headers[i].pixelAspectRatio ()",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testMultiPartThreading.cpp"
                        ,0x29a,"void (anonymous namespace)::readWholeFiles(const std::string &)");
        }
        pfVar32 = (float *)Imf_3_2::Header::screenWindowCenter();
        pfVar33 = (float *)Imf_3_2::Header::screenWindowCenter();
        if ((((*pfVar32 != *pfVar33) || (NAN(*pfVar32) || NAN(*pfVar33))) ||
            (pfVar32[1] != pfVar33[1])) || (NAN(pfVar32[1]) || NAN(pfVar33[1]))) {
          __assert_fail("header.screenWindowCenter () == headers[i].screenWindowCenter ()",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testMultiPartThreading.cpp"
                        ,0x29c,"void (anonymous namespace)::readWholeFiles(const std::string &)");
        }
        pfVar32 = (float *)Imf_3_2::Header::screenWindowWidth();
        fVar2 = *pfVar32;
        pfVar32 = (float *)Imf_3_2::Header::screenWindowWidth();
        if ((fVar2 != *pfVar32) || (NAN(fVar2) || NAN(*pfVar32))) {
          __assert_fail("header.screenWindowWidth () == headers[i].screenWindowWidth ()",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testMultiPartThreading.cpp"
                        ,0x29d,"void (anonymous namespace)::readWholeFiles(const std::string &)");
        }
        piVar34 = (int *)Imf_3_2::Header::lineOrder();
        iVar13 = *piVar34;
        piVar34 = (int *)Imf_3_2::Header::lineOrder();
        if (iVar13 != *piVar34) {
          __assert_fail("header.lineOrder () == headers[i].lineOrder ()",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testMultiPartThreading.cpp"
                        ,0x29e,"void (anonymous namespace)::readWholeFiles(const std::string &)");
        }
        piVar34 = (int *)Imf_3_2::Header::compression();
        iVar13 = *piVar34;
        piVar34 = (int *)Imf_3_2::Header::compression();
        if (iVar13 != *piVar34) {
          __assert_fail("header.compression () == headers[i].compression ()",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testMultiPartThreading.cpp"
                        ,0x29f,"void (anonymous namespace)::readWholeFiles(const std::string &)");
        }
        Imf_3_2::Header::channels();
        lVar48 = Imf_3_2::ChannelList::begin();
        Imf_3_2::Header::channels();
        lVar44 = Imf_3_2::ChannelList::begin();
        local_1b8[0]._M_impl._0_8_ = *(undefined8 *)(lVar48 + 0x120);
        local_1b8[0]._M_impl.super__Rb_tree_header._M_header._0_8_ = *(long *)(lVar48 + 0x128);
        local_358._sizeX = *(long *)(lVar44 + 0x120);
        local_358._sizeY = *(long *)(lVar44 + 0x128);
        cVar12 = Imf_3_2::Channel::operator==((Channel *)local_1b8,(Channel *)&local_358);
        if (cVar12 == '\0') {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," type ",6);
          poVar23 = (ostream *)std::ostream::operator<<(&std::cout,local_1b8[0]._M_impl._0_4_);
          std::__ostream_insert<char,std::char_traits<char>>(poVar23,", ",2);
          poVar23 = (ostream *)std::ostream::operator<<(poVar23,(int)local_358._sizeX);
          std::__ostream_insert<char,std::char_traits<char>>(poVar23," xSampling ",0xb);
          poVar23 = (ostream *)std::ostream::operator<<(poVar23,local_1b8[0]._M_impl._4_4_);
          std::__ostream_insert<char,std::char_traits<char>>(poVar23,", ",2);
          poVar23 = (ostream *)std::ostream::operator<<(poVar23,local_358._sizeX._4_4_);
          std::__ostream_insert<char,std::char_traits<char>>(poVar23," ySampling ",0xb);
          poVar23 = (ostream *)
                    std::ostream::operator<<
                              (poVar23,local_1b8[0]._M_impl.super__Rb_tree_header._M_header._M_color
                              );
          std::__ostream_insert<char,std::char_traits<char>>(poVar23,", ",2);
          poVar23 = (ostream *)std::ostream::operator<<(poVar23,(int)local_358._sizeY);
          std::__ostream_insert<char,std::char_traits<char>>(poVar23," pLinear ",9);
          poVar23 = std::ostream::_M_insert<bool>(SUB81(poVar23,0));
          std::__ostream_insert<char,std::char_traits<char>>(poVar23,", ",2);
          std::ostream::_M_insert<bool>(SUB81(poVar23,0));
          std::ostream::flush();
        }
        this_01 = (ChannelList *)Imf_3_2::Header::channels();
        pCVar35 = (ChannelList *)Imf_3_2::Header::channels();
        cVar12 = Imf_3_2::ChannelList::operator==(this_01,pCVar35);
        if (cVar12 == '\0') {
          __assert_fail("header.channels () == headers[i].channels ()",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testMultiPartThreading.cpp"
                        ,0x2b0,"void (anonymous namespace)::readWholeFiles(const std::string &)");
        }
        puVar30 = (undefined8 *)Imf_3_2::Header::name_abi_cxx11_();
        puVar31 = (undefined8 *)Imf_3_2::Header::name_abi_cxx11_();
        sVar50 = puVar30[1];
        if ((sVar50 != puVar31[1]) ||
           ((sVar50 != 0 && (iVar13 = bcmp((void *)*puVar30,(void *)*puVar31,sVar50), iVar13 != 0)))
           ) {
          __assert_fail("header.name () == headers[i].name ()",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testMultiPartThreading.cpp"
                        ,0x2b1,"void (anonymous namespace)::readWholeFiles(const std::string &)");
        }
        puVar30 = (undefined8 *)Imf_3_2::Header::type_abi_cxx11_();
        puVar31 = (undefined8 *)Imf_3_2::Header::type_abi_cxx11_();
        sVar50 = puVar30[1];
        if ((sVar50 != puVar31[1]) ||
           ((sVar50 != 0 && (iVar13 = bcmp((void *)*puVar30,(void *)*puVar31,sVar50), iVar13 != 0)))
           ) {
          __assert_fail("header.type () == headers[i].type ()",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testMultiPartThreading.cpp"
                        ,0x2b2,"void (anonymous namespace)::readWholeFiles(const std::string &)");
        }
        uVar26 = uVar26 + 1;
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Reading whole files ",0x14);
      std::ostream::flush();
      local_358._sizeX = 0;
      local_358._sizeY = 0;
      local_358._data = (float *)0x0;
      uVar39 = ((long)DAT_001efc30 - (long)(anonymous_namespace)::headers >> 3) * 0x6db6db6db6db6db7
      ;
      local_1b8[0]._M_impl._0_8_ = local_1b8[0]._M_impl._0_8_ & 0xffffffff00000000;
      uVar16 = (uint)uVar39;
      if ((int)uVar16 < 1) {
LAB_001870c6:
        if (0 < (int)uVar16) {
          local_368 = (WritingTaskData *)(ulong)(uVar16 & 0x7fffffff);
          p_Var37 = (_Vector_base<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
                     *)0x0;
          do {
            iVar13 = *(int *)(local_358._sizeX + (long)p_Var37 * 4);
            lVar48 = (long)iVar13;
            iVar14 = (int)(TiledInputPart *)&local_228;
            local_330 = p_Var37;
            if (*(int *)((anonymous_namespace)::partTypes + lVar48 * 4) == 0) {
              local_1b8[0]._M_impl.super__Rb_tree_header._M_header._0_8_ =
                   (ulong)(uint)local_1b8[0]._M_impl.super__Rb_tree_header._M_header._4_4_ << 0x20;
              local_1b8[0]._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
              local_1b8[0]._M_impl.super__Rb_tree_header._M_header._M_left =
                   &local_1b8[0]._M_impl.super__Rb_tree_header._M_header;
              local_1b8[0]._M_impl.super__Rb_tree_header._M_node_count = 0;
              local_1b8[0]._M_impl.super__Rb_tree_header._M_header._M_right =
                   local_1b8[0]._M_impl.super__Rb_tree_header._M_header._M_left;
              setInputFrameBuffer((FrameBuffer *)local_1b8,
                                  *(int *)((anonymous_namespace)::pixelTypes + lVar48 * 4),local_268
                                  ,(Array2D<float> *)local_398,&local_2c8,0xc5,0x107);
              Imf_3_2::InputPart::InputPart
                        ((InputPart *)&local_228,(MultiPartInputFile *)&local_2e8,iVar13);
              Imf_3_2::InputPart::setFrameBuffer((FrameBuffer *)&local_228);
              Imf_3_2::InputPart::readPixels(iVar14,0);
              iVar13 = *(int *)((anonymous_namespace)::pixelTypes + lVar48 * 4);
              if (iVar13 == 0) {
                bVar51 = checkPixels<unsigned_int>(local_268,0,0xc4,0,0x106,0xc5);
                if (!bVar51) {
                  __assert_fail("checkPixels<unsigned int> (uData, width, height)",
                                "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testMultiPartThreading.cpp"
                                ,0x2e2,
                                "void (anonymous namespace)::readWholeFiles(const std::string &)");
                }
              }
              else if (iVar13 == 1) {
                bVar51 = checkPixels<float>((Array2D<float> *)local_398,0,0xc4,0,0x106,0xc5);
                if (!bVar51) {
                  __assert_fail("checkPixels<float> (fData, width, height)",
                                "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testMultiPartThreading.cpp"
                                ,0x2e5,
                                "void (anonymous namespace)::readWholeFiles(const std::string &)");
                }
              }
              else if ((iVar13 == 2) &&
                      (bVar51 = checkPixels<Imath_3_2::half>(&local_2c8,0,0xc4,0,0x106,0xc5),
                      !bVar51)) {
                __assert_fail("checkPixels<half> (hData, width, height)",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testMultiPartThreading.cpp"
                              ,0x2e8,
                              "void (anonymous namespace)::readWholeFiles(const std::string &)");
              }
            }
            else {
              local_1b8[0]._M_impl.super__Rb_tree_header._M_header._0_8_ =
                   (ulong)(uint)local_1b8[0]._M_impl.super__Rb_tree_header._M_header._4_4_ << 0x20;
              local_1b8[0]._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
              local_1b8[0]._M_impl.super__Rb_tree_header._M_header._M_left =
                   &local_1b8[0]._M_impl.super__Rb_tree_header._M_header;
              local_1b8[0]._M_impl.super__Rb_tree_header._M_node_count = 0;
              local_1b8[0]._M_impl.super__Rb_tree_header._M_header._M_right =
                   local_1b8[0]._M_impl.super__Rb_tree_header._M_header._M_left;
              Imf_3_2::TiledInputPart::TiledInputPart
                        ((TiledInputPart *)&local_228,(MultiPartInputFile *)&local_2e8,iVar13);
              uVar20 = Imf_3_2::TiledInputPart::numXLevels();
              local_378 = (pointer)CONCAT44(local_378._4_4_,uVar20);
              iVar13 = Imf_3_2::TiledInputPart::numYLevels();
              if (0 < (int)local_378) {
                iVar19 = 0;
                do {
                  if (0 < iVar13) {
                    iVar15 = 0;
                    do {
                      cVar12 = Imf_3_2::TiledInputPart::isValidLevel(iVar14,iVar19);
                      if (cVar12 != '\0') {
                        iVar18 = Imf_3_2::TiledInputPart::levelWidth(iVar14);
                        iVar21 = Imf_3_2::TiledInputPart::levelHeight(iVar14);
                        setInputFrameBuffer((FrameBuffer *)local_1b8,
                                            *(int *)((anonymous_namespace)::pixelTypes + lVar48 * 4)
                                            ,local_268,(Array2D<float> *)local_398,&local_2c8,0xc5,
                                            0x107);
                        Imf_3_2::TiledInputPart::setFrameBuffer((FrameBuffer *)&local_228);
                        iVar17 = Imf_3_2::TiledInputPart::numXTiles(iVar14);
                        iVar22 = Imf_3_2::TiledInputPart::numYTiles(iVar14);
                        Imf_3_2::TiledInputPart::readTiles
                                  (iVar14,0,iVar17 + -1,0,iVar22 + -1,iVar19);
                        iVar17 = *(int *)((anonymous_namespace)::pixelTypes + lVar48 * 4);
                        if (iVar17 == 0) {
                          bVar51 = checkPixels<unsigned_int>
                                             (local_268,0,iVar18 + -1,0,iVar21 + -1,iVar18);
                          if (!bVar51) {
                            __assert_fail("checkPixels<unsigned int> (uData, w, h)",
                                          "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testMultiPartThreading.cpp"
                                          ,0x30c,
                                          "void (anonymous namespace)::readWholeFiles(const std::string &)"
                                         );
                          }
                        }
                        else if (iVar17 == 1) {
                          bVar51 = checkPixels<float>((Array2D<float> *)local_398,0,iVar18 + -1,0,
                                                      iVar21 + -1,iVar18);
                          if (!bVar51) {
                            __assert_fail("checkPixels<float> (fData, w, h)",
                                          "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testMultiPartThreading.cpp"
                                          ,0x30f,
                                          "void (anonymous namespace)::readWholeFiles(const std::string &)"
                                         );
                          }
                        }
                        else if ((iVar17 == 2) &&
                                (bVar51 = checkPixels<Imath_3_2::half>
                                                    (&local_2c8,0,iVar18 + -1,0,iVar21 + -1,iVar18),
                                !bVar51)) {
                          __assert_fail("checkPixels<half> (hData, w, h)",
                                        "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testMultiPartThreading.cpp"
                                        ,0x312,
                                        "void (anonymous namespace)::readWholeFiles(const std::string &)"
                                       );
                        }
                      }
                      iVar15 = iVar15 + 1;
                    } while (iVar13 != iVar15);
                  }
                  iVar19 = iVar19 + 1;
                } while (iVar19 != (int)local_378);
              }
            }
            std::
            _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
            ::~_Rb_tree(local_1b8);
            p_Var37 = (_Vector_base<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
                       *)((long)&(local_330->_M_impl).super__Vector_impl_data._M_start + 1);
          } while ((WritingTaskData *)p_Var37 != local_368);
        }
      }
      else {
        iVar13 = 0;
        do {
          if ((float *)local_358._sizeY == local_358._data) {
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      ((vector<int,std::allocator<int>> *)&local_358,(iterator)local_358._sizeY,
                       (int *)local_1b8);
          }
          else {
            *(int *)local_358._sizeY = iVar13;
            local_358._sizeY = local_358._sizeY + 4;
          }
          iVar13 = local_1b8[0]._M_impl._0_4_ + 1;
          local_1b8[0]._M_impl._0_4_ = iVar13;
        } while (iVar13 < (int)uVar16);
        uVar39 = uVar39 & 0xffffffff;
        if (0 < (int)uVar16) {
          do {
            iVar13 = random_int(uVar16);
            iVar14 = random_int(uVar16);
            uVar20 = *(undefined4 *)(local_358._sizeX + (long)iVar13 * 4);
            *(undefined4 *)(local_358._sizeX + (long)iVar13 * 4) =
                 *(undefined4 *)(local_358._sizeX + (long)iVar14 * 4);
            *(undefined4 *)(local_358._sizeX + (long)iVar14 * 4) = uVar20;
            uVar47 = (int)uVar39 - 1;
            uVar39 = (ulong)uVar47;
          } while (uVar47 != 0);
          goto LAB_001870c6;
        }
      }
      if ((void *)local_358._sizeX != (void *)0x0) {
        operator_delete((void *)local_358._sizeX,(long)local_358._data - local_358._sizeX);
      }
      Imf_3_2::MultiPartInputFile::~MultiPartInputFile((MultiPartInputFile *)&local_2e8);
      if (local_2c8._data != (half *)0x0) {
        operator_delete__(local_2c8._data);
      }
      if (local_388 != (WritingTaskData *)0x0) {
        operator_delete__(local_388);
      }
      if (local_268[0]._data != (uint *)0x0) {
        operator_delete__(local_268[0]._data);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Reading partial files ",0x16);
      std::ostream::flush();
      plVar45 = local_298[0];
      iVar13 = Imf_3_2::globalThreadCount();
      Imf_3_2::MultiPartInputFile::MultiPartInputFile
                ((MultiPartInputFile *)local_1b8,(char *)plVar45,iVar13,true);
      IlmThread_3_2::TaskGroup::TaskGroup((TaskGroup *)local_268);
      this_02 = (ThreadPool *)operator_new(0x10);
      IlmThread_3_2::ThreadPool::ThreadPool(this_02,0x20);
      iVar13 = local_270;
      if (0 < local_270) {
        do {
          pTVar29 = (Task *)operator_new(0x18);
          IlmThread_3_2::Task::Task(pTVar29,(TaskGroup *)local_268);
          *(undefined ***)pTVar29 = &PTR__Task_001ec2b0;
          *(_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
            **)(pTVar29 + 0x10) = local_1b8;
          IlmThread_3_2::ThreadPool::addTask((Task *)this_02);
          iVar13 = iVar13 + -1;
        } while (iVar13 != 0);
      }
      (**(code **)(*(long *)this_02 + 8))(this_02);
      IlmThread_3_2::TaskGroup::~TaskGroup((TaskGroup *)local_268);
      Imf_3_2::MultiPartInputFile::~MultiPartInputFile((MultiPartInputFile *)local_1b8);
      remove((char *)local_298[0]);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
      iVar14 = local_26c;
      std::ostream::put('X');
      std::ostream::flush();
      std::ostream::flush();
      iVar13 = iVar14 + 1;
    } while (iVar14 + 1 != local_274);
  }
  if (local_298[0] != local_288) {
    operator_delete(local_298[0],local_288[0] + 1);
  }
  return;
}

Assistant:

void
testWriteRead (
    int                partNumber,
    int                runCount,
    int                randomReadCount,
    const std::string& tempDir)
{
    cout << "Testing file with " << partNumber << " part(s)." << endl << flush;

    const std::string fn = tempDir + "imf_test_input_part.exr";

    for (int i = 0; i < runCount; i++)
    {
        generateRandomFile (partNumber, fn);
        readWholeFiles (fn);
        readFirstPart (fn);
        readPartialFiles (randomReadCount, fn);

        remove (fn.c_str ());

        cout << endl << flush;
    }
}